

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O0

string * __thiscall
ValidationState<BlockValidationResult>::ToString_abi_cxx11_
          (ValidationState<BlockValidationResult> *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  ValidationState<BlockValidationResult> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  string *this_00;
  allocator<char> local_29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar2 = in_RSI;
  this_00 = in_RDI;
  bVar1 = IsValid(in_stack_ffffffffffffff78);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)pbVar2,(allocator<char> *)in_stack_ffffffffffffffb8);
    std::allocator<char>::~allocator(&local_29);
  }
  else {
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffff78);
    if (bVar1) {
      std::__cxx11::string::string(pbVar2,in_stack_ffffffffffffffb8);
    }
    else {
      pbVar2 = &local_28;
      std::operator+(in_stack_ffffffffffffffb0,(char *)in_RSI);
      std::operator+(in_stack_ffffffffffffff90,pbVar2);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff78);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string ToString() const
    {
        if (IsValid()) {
            return "Valid";
        }

        if (!m_debug_message.empty()) {
            return m_reject_reason + ", " + m_debug_message;
        }

        return m_reject_reason;
    }